

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O2

HitInfo * __thiscall BVH::treehit(HitInfo *__return_storage_ptr__,BVH *this,Ray *ray,treenode *node)

{
  Object *pOVar1;
  undefined3 uVar2;
  float fVar3;
  bool bVar4;
  long lVar5;
  HitInfo *pHVar6;
  HitInfo *pHVar7;
  byte bVar8;
  vec3f vVar9;
  vec3f vVar10;
  float local_e8;
  float fStack_e4;
  HitInfo resl;
  HitInfo resr;
  
  bVar8 = 0;
  if ((node == (treenode *)0x0) || (bVar4 = AABox::intersect(&node->bound,ray), !bVar4)) {
    (__return_storage_ptr__->super_Hit).hit = false;
    (__return_storage_ptr__->super_Hit).p.x = 0.0;
    (__return_storage_ptr__->super_Hit).p.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).p.z = 0;
    (__return_storage_ptr__->super_Hit).Ns.y = 0.0;
    (__return_storage_ptr__->super_Hit).Ns.z = 0.0;
    (__return_storage_ptr__->super_Hit).Ng.x = 0.0;
    (__return_storage_ptr__->super_Hit).Ng.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).Ng.z = 0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).uv.y = 0;
    (__return_storage_ptr__->super_Hit).dpdu.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdu.z = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.x = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.z = 0.0;
    __return_storage_ptr__->object = (Object *)0x0;
  }
  else if (node->shape == (Primitive *)0x0) {
    treehit(&resl,this,ray,node->lc);
    if (resl.super_Hit.hit == false) {
      treehit(__return_storage_ptr__,this,ray,node->rc);
    }
    else {
      treehit(&resr,this,ray,node->rc);
      pHVar6 = &resl;
      if (resr.super_Hit.hit == true) {
        vVar9 = operator-(&resl.super_Hit.p,&ray->origin);
        vVar10 = operator-(&resr.super_Hit.p,&ray->origin);
        local_e8 = vVar9.x;
        fStack_e4 = vVar9.y;
        if (vVar10.z * vVar10.z + vVar10.x * vVar10.x + vVar10.y * vVar10.y <=
            vVar9.z * vVar9.z + local_e8 * local_e8 + fStack_e4 * fStack_e4) {
          pHVar6 = &resr;
        }
      }
      pHVar7 = __return_storage_ptr__;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        uVar2 = *(undefined3 *)&(pHVar6->super_Hit).field_0x1;
        fVar3 = (pHVar6->super_Hit).p.x;
        (pHVar7->super_Hit).hit = (pHVar6->super_Hit).hit;
        *(undefined3 *)&(pHVar7->super_Hit).field_0x1 = uVar2;
        (pHVar7->super_Hit).p.x = fVar3;
        pHVar6 = (HitInfo *)((long)pHVar6 + (ulong)bVar8 * -0x10 + 8);
        pHVar7 = (HitInfo *)((long)pHVar7 + (ulong)bVar8 * -0x10 + 8);
      }
    }
  }
  else {
    (__return_storage_ptr__->super_Hit).hit = false;
    (__return_storage_ptr__->super_Hit).p.x = 0.0;
    (__return_storage_ptr__->super_Hit).p.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).p.z = 0;
    (__return_storage_ptr__->super_Hit).Ns.y = 0.0;
    (__return_storage_ptr__->super_Hit).Ns.z = 0.0;
    (__return_storage_ptr__->super_Hit).Ng.x = 0.0;
    (__return_storage_ptr__->super_Hit).Ng.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).Ng.z = 0;
    *(undefined8 *)&(__return_storage_ptr__->super_Hit).uv.y = 0;
    (__return_storage_ptr__->super_Hit).dpdu.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdu.z = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.x = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.y = 0.0;
    (__return_storage_ptr__->super_Hit).dpdv.z = 0.0;
    __return_storage_ptr__->object = (Object *)0x0;
    resl.super_Hit.hit = false;
    resl.super_Hit.p.x = 0.0;
    resl.super_Hit.p.y = 0.0;
    resl.super_Hit.p.z = 0.0;
    resl.super_Hit.Ns.x = 0.0;
    resl.super_Hit.Ns.y = 0.0;
    resl.super_Hit.Ns.z = 0.0;
    resl.super_Hit.Ng.x = 0.0;
    resl.super_Hit.Ng.y = 0.0;
    resl.super_Hit.Ng.z = 0.0;
    resl.super_Hit.uv.x = 0.0;
    resl.super_Hit.uv.y = 0.0;
    resl.super_Hit.dpdu.x = 0.0;
    resl.super_Hit.dpdu.y = 0.0;
    resl.super_Hit.dpdu.z = 0.0;
    resl.super_Hit.dpdv.x = 0.0;
    resl.super_Hit.dpdv.y = 0.0;
    resl.super_Hit.dpdv.z = 0.0;
    bVar4 = opaqueHit(node,*ray,&resl.super_Hit);
    if (bVar4) {
      pOVar1 = node->object;
      pHVar6 = &resl;
      pHVar7 = __return_storage_ptr__;
      for (lVar5 = 0x12; lVar5 != 0; lVar5 = lVar5 + -1) {
        uVar2 = *(undefined3 *)&(pHVar6->super_Hit).field_0x1;
        (pHVar7->super_Hit).hit = (pHVar6->super_Hit).hit;
        *(undefined3 *)&(pHVar7->super_Hit).field_0x1 = uVar2;
        pHVar6 = (HitInfo *)((long)pHVar6 + (ulong)bVar8 * -8 + 4);
        pHVar7 = (HitInfo *)((long)pHVar7 + (ulong)bVar8 * -8 + 4);
      }
      __return_storage_ptr__->object = pOVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HitInfo treehit(const Ray& ray, treenode* node) {
		if (node == NULL) return HitInfo();
		if (!node->bound.intersect(ray)) return HitInfo();
		if (node->shape != NULL) {
			HitInfo hit;
			Primitive::Hit h;
			if (opaqueHit(node, ray, &h)) {
				hit = HitInfo(h, node->object);
			}
			return hit;
		}
		HitInfo resl = treehit(ray, node->lc);
		if (!resl) return treehit(ray, node->rc);
		HitInfo resr = treehit(ray, node->rc);
		return (!resr || sqrlen(resl.p - ray.origin) < sqrlen(resr.p - ray.origin))? resl: resr;
	}